

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delimited_message_util.cc
# Opt level: O2

bool google::protobuf::util::SerializeDelimitedToZeroCopyStream
               (MessageLite *message,ZeroCopyOutputStream *output)

{
  bool bVar1;
  CodedOutputStream coded_output;
  CodedOutputStream local_60;
  
  io::CodedOutputStream::CodedOutputStream<google::protobuf::io::ZeroCopyOutputStream,void>
            (&local_60,output);
  bVar1 = SerializeDelimitedToCodedStream(message,&local_60);
  io::CodedOutputStream::~CodedOutputStream(&local_60);
  return bVar1;
}

Assistant:

bool SerializeDelimitedToZeroCopyStream(const MessageLite& message,
                                        io::ZeroCopyOutputStream* output) {
  io::CodedOutputStream coded_output(output);
  return SerializeDelimitedToCodedStream(message, &coded_output);
}